

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O3

void nk_buffer_init_fixed(nk_buffer *b,void *m,nk_size size)

{
  undefined8 *puVar1;
  ulong __n;
  
  if (b == (nk_buffer *)0x0) {
    __assert_fail("b",
                  "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                  ,0x198d,"void nk_buffer_init_fixed(struct nk_buffer *, void *, nk_size)");
  }
  if (m != (void *)0x0) {
    if (size != 0) {
      __n = (ulong)b & 3;
      if (__n == 0) {
        b->needed = 0;
        b->calls = 0;
        *(undefined8 *)&b->grow_factor = 0;
        b->allocated = 0;
        (b->memory).ptr = (void *)0x0;
        (b->memory).size = 0;
        (b->pool).free = (nk_plugin_free)0x0;
        *(undefined8 *)&b->type = 0;
        (b->pool).userdata.ptr = (void *)0x0;
        (b->pool).alloc = (nk_plugin_alloc)0x0;
        *(undefined8 *)(b->marker + 1) = 0;
        b->marker[1].offset = 0;
        *(undefined8 *)b->marker = 0;
        b->marker[0].offset = 0;
      }
      else {
        memset(b,0,4 - __n);
        puVar1 = (undefined8 *)((long)b + (4 - __n));
        *puVar1 = 0;
        puVar1[1] = 0;
        puVar1[2] = 0;
        puVar1[3] = 0;
        puVar1[4] = 0;
        puVar1[5] = 0;
        puVar1[6] = 0;
        puVar1[7] = 0;
        puVar1[8] = 0;
        puVar1[9] = 0;
        puVar1[10] = 0;
        puVar1[0xb] = 0;
        puVar1[0xc] = 0;
        puVar1[0xd] = 0;
        *(undefined4 *)(puVar1 + 0xe) = 0;
        memset((void *)((long)puVar1 + 0x74),0,__n);
      }
      b->type = NK_BUFFER_FIXED;
      (b->memory).ptr = m;
      (b->memory).size = size;
      b->size = size;
      return;
    }
    __assert_fail("size",
                  "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                  ,0x198f,"void nk_buffer_init_fixed(struct nk_buffer *, void *, nk_size)");
  }
  __assert_fail("m",
                "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                ,0x198e,"void nk_buffer_init_fixed(struct nk_buffer *, void *, nk_size)");
}

Assistant:

NK_API void
nk_buffer_init_fixed(struct nk_buffer *b, void *m, nk_size size)
{
    NK_ASSERT(b);
    NK_ASSERT(m);
    NK_ASSERT(size);
    if (!b || !m || !size) return;

    nk_zero(b, sizeof(*b));
    b->type = NK_BUFFER_FIXED;
    b->memory.ptr = m;
    b->memory.size = size;
    b->size = size;
}